

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

char * cmsys::SystemTools::RemoveChars(char *str,char *toremove)

{
  size_t sVar1;
  bool bVar2;
  char *local_38;
  char *str2;
  char *ptr;
  char *clean_str;
  char *toremove_local;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    sVar1 = strlen(str);
    str_local = (char *)operator_new__(sVar1 + 1);
    str2 = str_local;
    for (toremove_local = str; local_38 = toremove, *toremove_local != '\0';
        toremove_local = toremove_local + 1) {
      while( true ) {
        bVar2 = false;
        if (*local_38 != '\0') {
          bVar2 = *toremove_local != *local_38;
        }
        if (!bVar2) break;
        local_38 = local_38 + 1;
      }
      if (*local_38 == '\0') {
        *str2 = *toremove_local;
        str2 = str2 + 1;
      }
    }
    *str2 = '\0';
  }
  return str_local;
}

Assistant:

char* SystemTools::RemoveChars(const char* str, const char* toremove)
{
  if (!str) {
    return KWSYS_NULLPTR;
  }
  char* clean_str = new char[strlen(str) + 1];
  char* ptr = clean_str;
  while (*str) {
    const char* str2 = toremove;
    while (*str2 && *str != *str2) {
      ++str2;
    }
    if (!*str2) {
      *ptr++ = *str;
    }
    ++str;
  }
  *ptr = '\0';
  return clean_str;
}